

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O2

uint32_t gpioDelay(uint32_t micros)

{
  FILE *pFVar1;
  uint32_t uVar2;
  
  pFVar1 = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    fprintf(pFVar1,"%s %s: microseconds=%u\n",myTimeStamp::buf,"gpioDelay",micros);
  }
  pFVar1 = _stderr;
  if (libInitialised == '\0') {
    uVar2 = 0xffffffe1;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      myTimeStamp();
      fprintf(pFVar1,"%s %s: pigpio uninitialised, call gpioInitialise()\n",myTimeStamp::buf,
              "gpioDelay");
    }
  }
  else {
    uVar2 = systReg[1];
    if (micros < 0x65) {
      do {
      } while (systReg[1] - uVar2 <= micros);
    }
    else {
      gpioSleep(0,micros / 1000000,micros % 1000000);
    }
    uVar2 = systReg[1] - uVar2;
  }
  return uVar2;
}

Assistant:

uint32_t gpioDelay(uint32_t micros)
{
   uint32_t start;

   DBG(DBG_USER, "microseconds=%u", micros);

   CHECK_INITED;

   start = systReg[SYST_CLO];

   if (micros <= PI_MAX_BUSY_DELAY)
      while ((systReg[SYST_CLO] - start) <= micros);
   else
      gpioSleep(PI_TIME_RELATIVE, (micros/MILLION), (micros%MILLION));

   return (systReg[SYST_CLO] - start);
}